

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O0

bool basisu::unpack_pvrtc2(void *p,color_rgba *pPixels)

{
  long in_RSI;
  long in_RDI;
  uint32_t sel;
  uint32_t i;
  color_rgba color_b_1;
  color_rgba color_a_1;
  color_rgba color_b;
  color_rgba color_a;
  color_rgba colors [4];
  pvrtc2_block *pBlock;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  anon_union_4_2_6eba8969_for_color_rgba_0 *this;
  anon_union_4_2_6eba8969_for_color_rgba_0 *this_00;
  anon_union_4_2_6eba8969_for_color_rgba_0 *col;
  uint local_5c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_38 [4];
  anon_union_4_2_6eba8969_for_color_rgba_0 aaStack_28 [2];
  long local_20;
  long local_18;
  bool local_1;
  
  if (((*(uint *)(in_RDI + 4) >> 0xf & 1) == 0) || ((*(uint *)(in_RDI + 4) & 1) != 0)) {
    local_1 = false;
  }
  else {
    this_00 = aaStack_28;
    col = local_38;
    local_20 = in_RDI;
    local_18 = in_RSI;
    do {
      this = col;
      color_rgba::color_rgba((color_rgba *)&this->field_1);
      col = this + 1;
    } while (col != this_00);
    if (*(int *)(local_20 + 4) < 0) {
      color_rgba::color_rgba
                ((color_rgba *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,0,0x516109);
      color_rgba::color_rgba
                ((color_rgba *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,0,0x516143);
      local_38[0].field_1 =
           (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
           convert_rgb_555_to_888((color_rgba *)&this->field_1);
      local_38[3].field_1 =
           (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
           convert_rgb_555_to_888((color_rgba *)&this->field_1);
      in_stack_ffffffffffffff80 =
           (((uint)local_38[0] >> 8 & 0xff) * 5 + ((uint)local_38[3] >> 8 & 0xff) * 3) / 8;
      color_rgba::set((color_rgba *)&this_00->field_1,(int)((ulong)this >> 0x20),(int)this,
                      in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff84 =
           (((uint)local_38[0] >> 8 & 0xff) * 3 + ((uint)local_38[3] >> 8 & 0xff) * 5) / 8;
      color_rgba::set((color_rgba *)&this_00->field_1,(int)((ulong)this >> 0x20),(int)this,
                      in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    }
    else {
      color_rgba::color_rgba
                ((color_rgba *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,0,0x5162d5);
      color_rgba::color_rgba
                ((color_rgba *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,0,0x516360);
      local_38[0].field_1 =
           (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
           convert_rgba_5554_to_8888((color_rgba *)&col->field_1);
      local_38[3].field_1 =
           (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
           convert_rgba_5554_to_8888((color_rgba *)&col->field_1);
    }
    color_rgba::set((color_rgba *)&this_00->field_1,(int)((ulong)this >> 0x20),(int)this,
                    in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    color_rgba::set((color_rgba *)&this_00->field_1,(int)((ulong)this >> 0x20),(int)this,
                    in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    for (local_5c = 0; local_5c < 0x10; local_5c = local_5c + 1) {
      *(anon_union_4_2_6eba8969_for_color_rgba_0 *)(local_18 + (ulong)local_5c * 4) =
           local_38[(int)(uint)*(byte *)(local_20 + (ulong)(local_5c >> 2)) >>
                    (sbyte)((local_5c & 3) << 1) & 3];
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool unpack_pvrtc2(const void *p, color_rgba *pPixels)
	{
		const pvrtc2_block* pBlock = static_cast<const pvrtc2_block*>(p);

		if ((!pBlock->m_opaque_color_data.m_hard_flag) || (pBlock->m_opaque_color_data.m_mod_flag))
		{
			// This mode isn't supported by the transcoder, so we aren't bothering with it here.
			return false;
		}

		color_rgba colors[4];

		if (pBlock->m_opaque_color_data.m_opaque_flag)
		{
			// colora=554
			color_rgba color_a(pBlock->m_opaque_color_data.m_red_a, pBlock->m_opaque_color_data.m_green_a, (pBlock->m_opaque_color_data.m_blue_a << 1) | (pBlock->m_opaque_color_data.m_blue_a >> 3), 255);
			
			// colora=555
			color_rgba color_b(pBlock->m_opaque_color_data.m_red_b, pBlock->m_opaque_color_data.m_green_b, pBlock->m_opaque_color_data.m_blue_b, 255);
						
			colors[0] = convert_rgb_555_to_888(color_a);
			colors[3] = convert_rgb_555_to_888(color_b);

			colors[1].set((colors[0].r * 5 + colors[3].r * 3) / 8, (colors[0].g * 5 + colors[3].g * 3) / 8, (colors[0].b * 5 + colors[3].b * 3) / 8, 255);
			colors[2].set((colors[0].r * 3 + colors[3].r * 5) / 8, (colors[0].g * 3 + colors[3].g * 5) / 8, (colors[0].b * 3 + colors[3].b * 5) / 8, 255);
		}
		else
		{
			// colora=4433 
			color_rgba color_a(
				(pBlock->m_trans_color_data.m_red_a << 1) | (pBlock->m_trans_color_data.m_red_a >> 3), 
				(pBlock->m_trans_color_data.m_green_a << 1) | (pBlock->m_trans_color_data.m_green_a >> 3),
				(pBlock->m_trans_color_data.m_blue_a << 2) | (pBlock->m_trans_color_data.m_blue_a >> 1), 
				pBlock->m_trans_color_data.m_alpha_a << 1);

			//colorb=4443
			color_rgba color_b(
				(pBlock->m_trans_color_data.m_red_b << 1) | (pBlock->m_trans_color_data.m_red_b >> 3),
				(pBlock->m_trans_color_data.m_green_b << 1) | (pBlock->m_trans_color_data.m_green_b >> 3),
				(pBlock->m_trans_color_data.m_blue_b << 1) | (pBlock->m_trans_color_data.m_blue_b >> 3),
				(pBlock->m_trans_color_data.m_alpha_b << 1) | 1);

			colors[0] = convert_rgba_5554_to_8888(color_a);
			colors[3] = convert_rgba_5554_to_8888(color_b);
		}

		colors[1].set((colors[0].r * 5 + colors[3].r * 3) / 8, (colors[0].g * 5 + colors[3].g * 3) / 8, (colors[0].b * 5 + colors[3].b * 3) / 8, (colors[0].a * 5 + colors[3].a * 3) / 8);
		colors[2].set((colors[0].r * 3 + colors[3].r * 5) / 8, (colors[0].g * 3 + colors[3].g * 5) / 8, (colors[0].b * 3 + colors[3].b * 5) / 8, (colors[0].a * 3 + colors[3].a * 5) / 8);

		for (uint32_t i = 0; i < 16; i++)
		{
			const uint32_t sel = (pBlock->m_modulation[i >> 2] >> ((i & 3) * 2)) & 3;
			pPixels[i] = colors[sel];
		}

		return true;
	}